

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O1

AssertionResult __thiscall
testing::internal::
CmpHelperEQ<std::tuple<int,double,char_const*>,std::tuple<int,double,char_const*>>
          (internal *this,char *expected_expression,char *actual_expression,
          tuple<int,_double,_const_char_*> *expected,tuple<int,_double,_const_char_*> *actual)

{
  _Head_base<1UL,_double,_false> *p_Var1;
  double dVar2;
  AssertionResult AVar4;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar3
  ;
  
  if (((((expected->super__Tuple_impl<0UL,_int,_double,_const_char_*>).
         super__Head_base<0UL,_int,_false>._M_head_impl !=
         (actual->super__Tuple_impl<0UL,_int,_double,_const_char_*>).
         super__Head_base<0UL,_int,_false>._M_head_impl) ||
       (dVar2 = (expected->super__Tuple_impl<0UL,_int,_double,_const_char_*>).
                super__Tuple_impl<1UL,_double,_const_char_*>.super__Head_base<1UL,_double,_false>.
                _M_head_impl,
       p_Var1 = &(actual->super__Tuple_impl<0UL,_int,_double,_const_char_*>).
                 super__Tuple_impl<1UL,_double,_const_char_*>.super__Head_base<1UL,_double,_false>,
       dVar2 != p_Var1->_M_head_impl)) || (NAN(dVar2) || NAN(p_Var1->_M_head_impl))) ||
     ((expected->super__Tuple_impl<0UL,_int,_double,_const_char_*>).
      super__Tuple_impl<1UL,_double,_const_char_*>.super__Tuple_impl<2UL,_const_char_*>.
      super__Head_base<2UL,_const_char_*,_false>._M_head_impl !=
      (actual->super__Tuple_impl<0UL,_int,_double,_const_char_*>).
      super__Tuple_impl<1UL,_double,_const_char_*>.super__Tuple_impl<2UL,_const_char_*>.
      super__Head_base<2UL,_const_char_*,_false>._M_head_impl)) {
    AVar4 = CmpHelperEQFailure<std::tuple<int,double,char_const*>,std::tuple<int,double,char_const*>>
                      (this,expected_expression,actual_expression,expected,actual);
    sVar3 = AVar4.message_.ptr_;
  }
  else {
    AVar4 = AssertionSuccess();
    sVar3 = AVar4.message_.ptr_;
  }
  AVar4.message_.ptr_ = sVar3.ptr_;
  AVar4._0_8_ = this;
  return AVar4;
}

Assistant:

AssertionResult CmpHelperEQ(const char* expected_expression,
                            const char* actual_expression,
                            const T1& expected,
                            const T2& actual) {
GTEST_DISABLE_MSC_WARNINGS_PUSH_(4389 /* signed/unsigned mismatch */)
  if (expected == actual) {
    return AssertionSuccess();
  }
GTEST_DISABLE_MSC_WARNINGS_POP_()

  return CmpHelperEQFailure(expected_expression, actual_expression, expected,
                            actual);
}